

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::(anonymous_namespace)::pquote_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Path *p)

{
  allocator local_81;
  string local_80;
  allocator local_59;
  string local_58;
  string local_38;
  _anonymous_namespace_ *local_18;
  Path *p_local;
  
  local_18 = this;
  p_local = (Path *)__return_storage_ptr__;
  Path::full_path_name_abi_cxx11_(&local_38,(Path *)this);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_58,"<",&local_59);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_80,">",&local_81);
  wquote(__return_storage_ptr__,&local_38,&local_58,&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string pquote(const Path &p) {
  return wquote(p.full_path_name(), "<", ">");
}